

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  bool bVar2;
  JavaType JVar3;
  char *pcVar4;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view end_varname;
  string_view end_varname_00;
  size_t sStackY_180;
  Options local_168;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  bVar2 = IsByteStringWithCustomDefaultValue(this->descriptor_);
  if (bVar2) {
    text._M_str = "private static final $field_type$ $bytes_default$ = $default$;\n";
    text._M_len = 0x3f;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text);
  }
  if ((this->context_->options_).opensource_runtime == false) {
    text_00._M_str = "@com.google.protobuf.ProtoField(\n  isRequired=$required$)\n";
    text_00._M_len = 0x3a;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text_00);
    bVar2 = HasHasbit(this->descriptor_);
    if (bVar2) {
      text_01._M_str =
           "@com.google.protobuf.ProtoPresenceCheckedField(\n  presenceBitsId=$bit_field_id$,\n  mask=$bit_field_mask$)\n"
      ;
      text_01._M_len = 0x6a;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&this->variables_,text_01);
    }
  }
  vars = &this->variables_;
  text_02._M_str = "private $field_type$ $name$_;\n";
  text_02._M_len = 0x1e;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  PrintExtraFieldInfo(vars,printer);
  bVar2 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar2) {
    pFVar1 = this->descriptor_;
    Options::Options(&local_78,&this->context_->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_78,false,false,false);
    Options::~Options(&local_78);
    text_03._M_str =
         "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $is_field_present_message$;\n}\n"
    ;
    text_03._M_len = 0x77;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_03);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  pFVar1 = this->descriptor_;
  Options::Options(&local_c8,&this->context_->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,&local_c8,false,false,false);
  Options::~Options(&local_c8);
  text_04._M_str =
       "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return $name$_;\n}\n"
  ;
  text_04._M_len = 99;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  Options::Options(&local_118,&this->context_->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,SETTER,&local_118,false,false,true);
  Options::~Options(&local_118);
  text_05._M_str =
       "private void set$capitalized_name$($type$ value) {\n$null_check$  $set_has_field_bit_message$\n  $name$_ = value;\n}\n"
  ;
  text_05._M_len = 0x72;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_05);
  pFVar1 = this->descriptor_;
  Options::Options(&local_168,&this->context_->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_168,false,false,true);
  Options::~Options(&local_168);
  text_06._M_str = "private void clear$capitalized_name$() {\n  $clear_has_field_bit_message$\n";
  text_06._M_len = 0x49;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_06);
  JVar3 = GetJavaType(this->descriptor_);
  if (JVar3 - JAVATYPE_STRING < 2) {
    pcVar4 = "  $name$_ = getDefaultInstance().get$capitalized_name$();\n";
    sStackY_180 = 0x3a;
  }
  else {
    pcVar4 = "  $name$_ = $default$;\n";
    sStackY_180 = 0x17;
  }
  text_07._M_str = pcVar4;
  text_07._M_len = sStackY_180;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_07);
  text_08._M_str = "}\n";
  text_08._M_len = 2;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_08);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  if (IsByteStringWithCustomDefaultValue(descriptor_)) {
    // allocate this once statically since we know ByteStrings are immutable
    // values that can be reused.
    printer->Print(
        variables_,
        "private static final $field_type$ $bytes_default$ = $default$;\n");
  }
  if (!context_->options().opensource_runtime) {
    printer->Print(variables_,
                   "@com.google.protobuf.ProtoField(\n"
                   "  isRequired=$required$)\n");
    if (HasHasbit(descriptor_)) {
      printer->Print(variables_,
                     "@com.google.protobuf.ProtoPresenceCheckedField(\n"
                     "  presenceBitsId=$bit_field_id$,\n"
                     "  mask=$bit_field_mask$)\n");
    }
  }
  printer->Print(variables_, "private $field_type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $is_field_present_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  $set_has_field_bit_message$\n"
                 "  $name$_ = value;\n"
                 "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $clear_has_field_bit_message$\n");
  JavaType type = GetJavaType(descriptor_);
  if (type == JAVATYPE_STRING || type == JAVATYPE_BYTES) {
    // The default value is not a simple literal so we want to avoid executing
    // it multiple times.  Instead, get the default out of the default instance.
    printer->Print(
        variables_,
        "  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
  } else {
    printer->Print(variables_, "  $name$_ = $default$;\n");
  }
  printer->Print(variables_, "}\n");
}